

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O1

int ar_parse_common_header(ar *ar,archive_entry *entry,char *h)

{
  int extraout_EAX;
  uint64_t uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  uVar1 = ar_atol10(h + 0x10,0xc);
  archive_entry_set_mtime(entry,uVar1,0);
  uVar1 = ar_atol10(h + 0x1c,6);
  archive_entry_set_uid(entry,uVar1 & 0xffffffff);
  uVar1 = ar_atol10(h + 0x22,6);
  archive_entry_set_gid(entry,uVar1 & 0xffffffff);
  pcVar4 = h + 0x28;
  iVar2 = 8;
  while( true ) {
    if ((*pcVar4 != ' ') && (*pcVar4 != '\t')) goto LAB_00493d72;
    bVar7 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar7) break;
    pcVar4 = pcVar4 + 1;
  }
  iVar2 = -1;
  pcVar4 = h + 0x30;
LAB_00493d72:
  uVar3 = (int)*pcVar4 - 0x30;
  uVar5 = 0;
  if (uVar3 < 8 && '/' < *pcVar4) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      if (iVar2 == (int)lVar6) break;
      if (uVar5 >> 0x3d != 0) {
        uVar5 = 0xffffffffffffffff;
        break;
      }
      uVar5 = (ulong)uVar3 + uVar5 * 8;
      if (pcVar4[lVar6 + 1] < 0x30) break;
      uVar3 = (int)pcVar4[lVar6 + 1] - 0x30;
      lVar6 = lVar6 + 1;
    } while (uVar3 < 8);
  }
  archive_entry_set_mode(entry,(mode_t)uVar5);
  uVar1 = ar_atol10(h + 0x30,10);
  ar->entry_offset = 0;
  ar->entry_padding = (ulong)((uint)uVar1 & 1);
  archive_entry_set_size(entry,uVar1);
  ar->entry_bytes_remaining = uVar1;
  return extraout_EAX;
}

Assistant:

static int
ar_parse_common_header(struct ar *ar, struct archive_entry *entry,
    const char *h)
{
	uint64_t n;

	/* Copy remaining header */
	archive_entry_set_mtime(entry,
	    (time_t)ar_atol10(h + AR_date_offset, AR_date_size), 0L);
	archive_entry_set_uid(entry,
	    (uid_t)ar_atol10(h + AR_uid_offset, AR_uid_size));
	archive_entry_set_gid(entry,
	    (gid_t)ar_atol10(h + AR_gid_offset, AR_gid_size));
	archive_entry_set_mode(entry,
	    (mode_t)ar_atol8(h + AR_mode_offset, AR_mode_size));
	n = ar_atol10(h + AR_size_offset, AR_size_size);

	ar->entry_offset = 0;
	ar->entry_padding = n % 2;
	archive_entry_set_size(entry, n);
	ar->entry_bytes_remaining = n;
	return (ARCHIVE_OK);
}